

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.cpp
# Opt level: O2

void __thiscall chrono::ChLinkLock::UpdateForces(ChLinkLock *this,double mytime)

{
  ChVector<double> *this_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ChLinkForce *pCVar3;
  ChLinkLimit *pCVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [64];
  undefined1 auVar9 [16];
  undefined1 auVar19 [64];
  undefined1 auVar10 [16];
  undefined1 auVar20 [64];
  undefined1 auVar11 [16];
  undefined1 auVar21 [64];
  undefined1 auVar12 [16];
  undefined1 auVar22 [64];
  undefined1 auVar13 [16];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar14 [16];
  undefined1 auVar25 [64];
  undefined1 auVar26 [32];
  double dVar29;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  ChVector<double> arm_xaxis;
  double local_e8;
  double dStack_e0;
  double local_d8;
  undefined1 local_a8 [32];
  ChVector<double> local_88;
  ChVector<double> local_68;
  undefined1 local_48 [16];
  double local_38;
  ChVector<double> local_30;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  
  ChLinkMarkers::UpdateForces(&this->super_ChLinkMarkers,mytime);
  pCVar3 = (this->force_D)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>.
           super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl;
  if ((pCVar3 != (ChLinkForce *)0x0) && (pCVar3->m_active == true)) {
    dVar5 = ChLinkForce::GetForce
                      (pCVar3,(this->super_ChLinkMarkers).dist - this->d_restlength,
                       (this->super_ChLinkMarkers).dist_dt,
                       (this->super_ChLinkMarkers).super_ChLink.super_ChLinkBase.super_ChPhysicsItem
                       .super_ChObj.ChTime);
    Vnorm<double>(&local_88,&(this->super_ChLinkMarkers).relM.pos);
    dVar7 = (this->super_ChLinkMarkers).C_force.m_data[2];
    dVar8 = (this->super_ChLinkMarkers).C_force.m_data[1];
    (this->super_ChLinkMarkers).C_force.m_data[0] =
         dVar5 * local_88.m_data[0] + (this->super_ChLinkMarkers).C_force.m_data[0];
    (this->super_ChLinkMarkers).C_force.m_data[1] = dVar5 * local_88.m_data[1] + dVar8;
    (this->super_ChLinkMarkers).C_force.m_data[2] = dVar5 * local_88.m_data[2] + dVar7;
  }
  pCVar3 = (this->force_R)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>.
           super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl;
  if ((pCVar3 != (ChLinkForce *)0x0) && (pCVar3->m_active == true)) {
    dVar6 = ChLinkForce::GetForce
                      (pCVar3,(this->super_ChLinkMarkers).relAngle,0.0,
                       (this->super_ChLinkMarkers).super_ChLink.super_ChLinkBase.super_ChPhysicsItem
                       .super_ChObj.ChTime);
    dVar7 = (this->super_ChLinkMarkers).relAxis.m_data[2];
    dVar5 = (this->super_ChLinkMarkers).relAxis.m_data[1];
    this_00 = &(this->super_ChLinkMarkers).relWvel;
    dVar8 = (this->super_ChLinkMarkers).C_torque.m_data[2];
    dVar29 = (this->super_ChLinkMarkers).C_torque.m_data[1];
    (this->super_ChLinkMarkers).C_torque.m_data[0] =
         dVar6 * (this->super_ChLinkMarkers).relAxis.m_data[0] +
         (this->super_ChLinkMarkers).C_torque.m_data[0];
    (this->super_ChLinkMarkers).C_torque.m_data[1] = dVar6 * dVar5 + dVar29;
    (this->super_ChLinkMarkers).C_torque.m_data[2] = dVar6 * dVar7 + dVar8;
    dVar7 = ChVector<double>::Length(this_00);
    dVar5 = ChLinkForce::GetForce
                      ((this->force_R)._M_t.
                       super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>
                       .super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl,0.0,dVar7,
                       (this->super_ChLinkMarkers).super_ChLink.super_ChLinkBase.super_ChPhysicsItem
                       .super_ChObj.ChTime);
    Vnorm<double>(&local_88,this_00);
    dVar7 = (this->super_ChLinkMarkers).C_torque.m_data[2];
    dVar8 = (this->super_ChLinkMarkers).C_torque.m_data[1];
    (this->super_ChLinkMarkers).C_torque.m_data[0] =
         dVar5 * local_88.m_data[0] + (this->super_ChLinkMarkers).C_torque.m_data[0];
    (this->super_ChLinkMarkers).C_torque.m_data[1] = dVar5 * local_88.m_data[1] + dVar8;
    (this->super_ChLinkMarkers).C_torque.m_data[2] = dVar5 * local_88.m_data[2] + dVar7;
  }
  dVar7 = DAT_011dd3e8;
  pCVar3 = (this->force_X)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>.
           super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = VNULL;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = DAT_011dd3e0;
  if ((pCVar3 != (ChLinkForce *)0x0) && (pCVar3->m_active == true)) {
    auVar18._0_8_ =
         ChLinkForce::GetForce
                   (pCVar3,(this->super_ChLinkMarkers).relM.pos.m_data[0],
                    (this->super_ChLinkMarkers).relM_dt.pos.m_data[0],
                    (this->super_ChLinkMarkers).super_ChLink.super_ChLinkBase.super_ChPhysicsItem.
                    super_ChObj.ChTime);
    auVar18._8_56_ = extraout_var;
    auVar9 = auVar18._0_16_;
  }
  pCVar3 = (this->force_Y)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>.
           super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl;
  if ((pCVar3 != (ChLinkForce *)0x0) && (pCVar3->m_active == true)) {
    auVar19._0_8_ =
         ChLinkForce::GetForce
                   (pCVar3,(this->super_ChLinkMarkers).relM.pos.m_data[1],
                    (this->super_ChLinkMarkers).relM_dt.pos.m_data[1],
                    (this->super_ChLinkMarkers).super_ChLink.super_ChLinkBase.super_ChPhysicsItem.
                    super_ChObj.ChTime);
    auVar19._8_56_ = extraout_var_00;
    auVar10 = auVar19._0_16_;
  }
  pCVar3 = (this->force_Z)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>.
           super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl;
  if ((pCVar3 != (ChLinkForce *)0x0) && (pCVar3->m_active == true)) {
    dVar7 = ChLinkForce::GetForce
                      (pCVar3,(this->super_ChLinkMarkers).relM.pos.m_data[2],
                       (this->super_ChLinkMarkers).relM_dt.pos.m_data[2],
                       (this->super_ChLinkMarkers).super_ChLink.super_ChLinkBase.super_ChPhysicsItem
                       .super_ChObj.ChTime);
  }
  auVar9 = vunpcklpd_avx(auVar9,auVar10);
  dVar8 = (this->super_ChLinkMarkers).C_force.m_data[2];
  dVar5 = (this->super_ChLinkMarkers).C_force.m_data[1];
  (this->super_ChLinkMarkers).C_force.m_data[0] =
       auVar9._0_8_ + (this->super_ChLinkMarkers).C_force.m_data[0];
  (this->super_ChLinkMarkers).C_force.m_data[1] = auVar9._8_8_ + dVar5;
  (this->super_ChLinkMarkers).C_force.m_data[2] = dVar7 + dVar8;
  dVar7 = DAT_011dd3e8;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = VNULL;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = DAT_011dd3e0;
  pCVar3 = (this->force_Rx)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>.
           super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl;
  if ((pCVar3 != (ChLinkForce *)0x0) && (pCVar3->m_active == true)) {
    auVar20._0_8_ =
         ChLinkForce::GetForce
                   (pCVar3,(this->super_ChLinkMarkers).relRotaxis.m_data[0],
                    (this->super_ChLinkMarkers).relWvel.m_data[0],
                    (this->super_ChLinkMarkers).super_ChLink.super_ChLinkBase.super_ChPhysicsItem.
                    super_ChObj.ChTime);
    auVar20._8_56_ = extraout_var_01;
    auVar11 = auVar20._0_16_;
  }
  pCVar3 = (this->force_Ry)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>.
           super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl;
  if ((pCVar3 != (ChLinkForce *)0x0) && (pCVar3->m_active == true)) {
    auVar21._0_8_ =
         ChLinkForce::GetForce
                   (pCVar3,(this->super_ChLinkMarkers).relRotaxis.m_data[1],
                    (this->super_ChLinkMarkers).relWvel.m_data[1],
                    (this->super_ChLinkMarkers).super_ChLink.super_ChLinkBase.super_ChPhysicsItem.
                    super_ChObj.ChTime);
    auVar21._8_56_ = extraout_var_02;
    auVar12 = auVar21._0_16_;
  }
  pCVar3 = (this->force_Rz)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>.
           super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl;
  if ((pCVar3 != (ChLinkForce *)0x0) && (pCVar3->m_active == true)) {
    dVar7 = ChLinkForce::GetForce
                      (pCVar3,(this->super_ChLinkMarkers).relRotaxis.m_data[2],
                       (this->super_ChLinkMarkers).relWvel.m_data[2],
                       (this->super_ChLinkMarkers).super_ChLink.super_ChLinkBase.super_ChPhysicsItem
                       .super_ChObj.ChTime);
  }
  auVar9 = vunpcklpd_avx(auVar11,auVar12);
  dVar8 = (this->super_ChLinkMarkers).C_torque.m_data[2];
  dVar5 = (this->super_ChLinkMarkers).C_torque.m_data[1];
  (this->super_ChLinkMarkers).C_torque.m_data[0] =
       auVar9._0_8_ + (this->super_ChLinkMarkers).C_torque.m_data[0];
  (this->super_ChLinkMarkers).C_torque.m_data[1] = auVar9._8_8_ + dVar5;
  (this->super_ChLinkMarkers).C_torque.m_data[2] = dVar7 + dVar8;
  dVar7 = DAT_011dd3e8;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = VNULL;
  local_d8 = VNULL;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = DAT_011dd3e0;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = DAT_011dd3e8;
  pCVar4 = (this->limit_X)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar4 != (ChLinkLimit *)0x0) && (pCVar4->m_active == true)) {
    auVar22._0_8_ =
         ChLinkLimit::GetForce
                   (pCVar4,(this->super_ChLinkMarkers).relM.pos.m_data[0],
                    (this->super_ChLinkMarkers).relM_dt.pos.m_data[0]);
    auVar22._8_56_ = extraout_var_03;
    auVar13 = auVar22._0_16_;
  }
  pCVar4 = (this->limit_Y)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  auVar9 = auVar14;
  if ((pCVar4 != (ChLinkLimit *)0x0) && (pCVar4->m_active == true)) {
    auVar23._0_8_ =
         ChLinkLimit::GetForce
                   (pCVar4,(this->super_ChLinkMarkers).relM.pos.m_data[1],
                    (this->super_ChLinkMarkers).relM_dt.pos.m_data[1]);
    auVar23._8_56_ = extraout_var_04;
    auVar9 = auVar23._0_16_;
  }
  pCVar4 = (this->limit_Z)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar4 != (ChLinkLimit *)0x0) && (pCVar4->m_active == true)) {
    dVar7 = ChLinkLimit::GetForce
                      (pCVar4,(this->super_ChLinkMarkers).relM.pos.m_data[2],
                       (this->super_ChLinkMarkers).relM_dt.pos.m_data[2]);
  }
  pCVar4 = (this->limit_D)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  auVar9 = vunpcklpd_avx(auVar13,auVar9);
  local_a8 = ZEXT1632(auVar9);
  if ((pCVar4 != (ChLinkLimit *)0x0) && (pCVar4->m_active == true)) {
    Vnorm<double>(&local_88,&(this->super_ChLinkMarkers).relM.pos);
    dVar8 = ChLinkLimit::GetForce
                      ((this->limit_D)._M_t.
                       super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
                       .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl,
                       (this->super_ChLinkMarkers).dist,(this->super_ChLinkMarkers).dist_dt);
    local_a8._0_8_ = auVar9._0_8_;
    local_a8._8_8_ = auVar9._8_8_;
    dVar5 = (double)local_a8._0_8_ + dVar8 * local_88.m_data[0];
    dVar29 = (double)local_a8._8_8_ + dVar8 * local_88.m_data[1];
    local_a8 = ZEXT1632(CONCAT88(dVar29,dVar5));
    dVar7 = dVar7 + dVar8 * local_88.m_data[2];
  }
  pCVar4 = (this->limit_Rx)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar4 != (ChLinkLimit *)0x0) && (pCVar4->m_active == true)) {
    local_d8 = ChLinkLimit::GetForce
                         (pCVar4,(this->super_ChLinkMarkers).relRotaxis.m_data[0],
                          (this->super_ChLinkMarkers).relWvel.m_data[0]);
  }
  pCVar4 = (this->limit_Ry)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar4 != (ChLinkLimit *)0x0) && (pCVar4->m_active == true)) {
    auVar24._0_8_ =
         ChLinkLimit::GetForce
                   (pCVar4,(this->super_ChLinkMarkers).relRotaxis.m_data[1],
                    (this->super_ChLinkMarkers).relWvel.m_data[1]);
    auVar24._8_56_ = extraout_var_05;
    auVar14 = auVar24._0_16_;
  }
  pCVar4 = (this->limit_Rz)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar4 != (ChLinkLimit *)0x0) && (pCVar4->m_active == true)) {
    auVar25._0_8_ =
         ChLinkLimit::GetForce
                   (pCVar4,(this->super_ChLinkMarkers).relRotaxis.m_data[2],
                    (this->super_ChLinkMarkers).relWvel.m_data[2]);
    auVar25._8_56_ = extraout_var_06;
    auVar15 = auVar25._0_16_;
  }
  pCVar4 = (this->limit_Rp)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  auVar28 = vunpcklpd_avx(auVar14,auVar15);
  if ((pCVar4 != (ChLinkLimit *)0x0) && (pCVar4->m_active == true)) {
    VaxisXfromQuat(&(this->super_ChLinkMarkers).relM.rot);
    dVar8 = VangleYZplaneNorm<double>(&local_88);
    dVar5 = VangleRX<double>(&local_88);
    local_30.m_data[0] = 0.0;
    local_30.m_data[1] = local_88.m_data[1];
    local_30.m_data[2] = local_88.m_data[2];
    Vcross<double,double>((ChVector<double> *)&VECT_X,&local_30);
    local_38 = local_68.m_data[2];
    Vnorm<double>(&local_68,(ChVector<double> *)local_48);
    local_48._8_8_ = local_68.m_data[1];
    local_48._0_8_ = local_68.m_data[0];
    auVar16._8_8_ = 0;
    auVar16._0_8_ = local_68.m_data[2];
    local_38 = local_68.m_data[2];
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (this->super_ChLinkMarkers).relWvel.m_data[0];
    auVar27._8_8_ = 0;
    auVar27._0_8_ = local_68.m_data[1] * (this->super_ChLinkMarkers).relWvel.m_data[1];
    auVar9 = vfmadd132sd_fma(local_48,auVar27,auVar1);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (this->super_ChLinkMarkers).relWvel.m_data[2];
    auVar9 = vfmadd231sd_fma(auVar9,auVar16,auVar2);
    dVar8 = ChLinkLimit::GetPolarForce
                      ((this->limit_Rp)._M_t.
                       super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
                       .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl,dVar8,
                       auVar9._0_8_,dVar5);
    local_d8 = local_d8 + dVar8 * (double)local_48._0_8_;
    local_e8 = auVar28._0_8_;
    dStack_e0 = auVar28._8_8_;
    auVar28._0_8_ = local_e8 + dVar8 * (double)local_48._8_8_;
    auVar28._8_8_ = dStack_e0 + dVar8 * local_38;
  }
  auVar26._8_8_ = local_d8;
  auVar26._0_8_ = local_d8;
  auVar26._16_8_ = local_d8;
  auVar26._24_8_ = local_d8;
  auVar17._8_8_ = dVar7;
  auVar17._0_8_ = dVar7;
  auVar17._16_8_ = dVar7;
  auVar17._24_8_ = dVar7;
  auVar17 = vblendpd_avx(auVar17,local_a8,0xb);
  auVar17 = vblendpd_avx(auVar17,auVar26,8);
  dVar7 = (this->super_ChLinkMarkers).C_force.m_data[1];
  dVar8 = (this->super_ChLinkMarkers).C_force.m_data[2];
  dVar5 = (this->super_ChLinkMarkers).C_torque.m_data[0];
  (this->super_ChLinkMarkers).C_force.m_data[0] =
       auVar17._0_8_ + (this->super_ChLinkMarkers).C_force.m_data[0];
  (this->super_ChLinkMarkers).C_force.m_data[1] = auVar17._8_8_ + dVar7;
  (this->super_ChLinkMarkers).C_force.m_data[2] = auVar17._16_8_ + dVar8;
  (this->super_ChLinkMarkers).C_torque.m_data[0] = auVar17._24_8_ + dVar5;
  dVar7 = (this->super_ChLinkMarkers).C_torque.m_data[2];
  (this->super_ChLinkMarkers).C_torque.m_data[1] =
       auVar28._0_8_ + (this->super_ChLinkMarkers).C_torque.m_data[1];
  (this->super_ChLinkMarkers).C_torque.m_data[2] = auVar28._8_8_ + dVar7;
  return;
}

Assistant:

void ChLinkLock::UpdateForces(double mytime) {
    ChLinkMarkers::UpdateForces(mytime);

    ChVector<> m_force = VNULL;
    ChVector<> m_torque = VNULL;

    // COMPUTE THE FORCES IN THE LINK, FOR EXAMPLE
    // CAUSED BY SPRINGS
    // NOTE!!!!!   C_force and C_torque   are considered in the reference coordsystem
    // of marker2  (the MAIN marker), and their application point is considered the
    // origin of marker1 (the SLAVE marker)

    // 1)========== the generic spring-damper

    if (force_D && force_D->IsActive()) {
        double dfor;
        dfor = force_D->GetForce((dist - d_restlength), dist_dt, ChTime);
        m_force = Vmul(Vnorm(relM.pos), dfor);

        C_force = Vadd(C_force, m_force);
    }

    // 2)========== the generic torsional spring / torsional damper

    if (force_R && force_R->IsActive()) {
        double tor;
        // 1) the tors. spring
        tor = force_R->GetForce(relAngle, 0, ChTime);
        m_torque = Vmul(relAxis, tor);
        C_torque = Vadd(C_torque, m_torque);
        // 2) the tors. damper
        double angle_dt = Vlength(relWvel);
        tor = force_R->GetForce(0, angle_dt, ChTime);
        m_torque = Vmul(Vnorm(relWvel), tor);
        C_torque = Vadd(C_torque, m_torque);
    }

    // 3)========== the XYZ forces

    m_force = VNULL;

    if (force_X && force_X->IsActive()) {
        m_force.x() = force_X->GetForce(relM.pos.x(), relM_dt.pos.x(), ChTime);
    }

    if (force_Y && force_Y->IsActive()) {
        m_force.y() = force_Y->GetForce(relM.pos.y(), relM_dt.pos.y(), ChTime);
    }

    if (force_Z && force_Z->IsActive()) {
        m_force.z() = force_Z->GetForce(relM.pos.z(), relM_dt.pos.z(), ChTime);
    }

    C_force = Vadd(C_force, m_force);

    // 4)========== the RxRyRz forces (torques)

    m_torque = VNULL;

    if (force_Rx && force_Rx->IsActive()) {
        m_torque.x() = force_Rx->GetForce(relRotaxis.x(), relWvel.x(), ChTime);
    }

    if (force_Ry && force_Ry->IsActive()) {
        m_torque.y() = force_Ry->GetForce(relRotaxis.y(), relWvel.y(), ChTime);
    }

    if (force_Rz && force_Rz->IsActive()) {
        m_torque.z() = force_Rz->GetForce(relRotaxis.z(), relWvel.z(), ChTime);
    }

    C_torque = Vadd(C_torque, m_torque);

    // ========== the link-limits "cushion forces"

    m_force = VNULL;
    m_torque = VNULL;

    if (limit_X && limit_X->IsActive()) {
        m_force.x() = limit_X->GetForce(relM.pos.x(), relM_dt.pos.x());
    }
    if (limit_Y && limit_Y->IsActive()) {
        m_force.y() = limit_Y->GetForce(relM.pos.y(), relM_dt.pos.y());
    }
    if (limit_Z && limit_Z->IsActive()) {
        m_force.z() = limit_Z->GetForce(relM.pos.z(), relM_dt.pos.z());
    }

    if (limit_D && limit_D->IsActive()) {
        m_force = Vadd(m_force, Vmul(Vnorm(relM.pos), limit_D->GetForce(dist, dist_dt)));
    }

    if (limit_Rx && limit_Rx->IsActive()) {
        m_torque.x() = limit_Rx->GetForce(relRotaxis.x(), relWvel.x());
    }
    if (limit_Ry && limit_Ry->IsActive()) {
        m_torque.y() = limit_Ry->GetForce(relRotaxis.y(), relWvel.y());
    }
    if (limit_Rz && limit_Rz->IsActive()) {
        m_torque.z() = limit_Rz->GetForce(relRotaxis.z(), relWvel.z());
    }
    if (limit_Rp && limit_Rp->IsActive()) {
        ChVector<> arm_xaxis = VaxisXfromQuat(relM.rot);  // the X axis of the marker1, respect to m2.
        double zenith = VangleYZplaneNorm(arm_xaxis);     // the angle of m1 Xaxis about normal to YZ plane
        double polar = VangleRX(arm_xaxis);               // the polar angle of m1 Xaxis spinning about m2 Xaxis

        ChVector<> projected_arm(0, arm_xaxis.y(), arm_xaxis.z());
        ChVector<> torq_axis;
        torq_axis = Vcross(VECT_X, projected_arm);
        torq_axis = Vnorm(torq_axis);  // the axis of torque, laying on YZ plane.

        double zenithspeed = Vdot(torq_axis, relWvel);  // the speed of zenith rotation toward cone.

        m_torque = Vadd(m_torque, Vmul(torq_axis, limit_Rp->GetPolarForce(zenith, zenithspeed, polar)));
    }

    C_force = Vadd(C_force, m_force);     // +++
    C_torque = Vadd(C_torque, m_torque);  // +++

    // ========== other forces??
}